

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O3

void check(double d)

{
  byte *pbVar1;
  char cVar2;
  char cVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  char *pcVar12;
  runtime_error *this;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  char cVar17;
  uint uVar18;
  ulong uVar19;
  byte bVar20;
  char *pcVar21;
  char *pcVar22;
  ulong uVar23;
  char *pcVar24;
  long lVar25;
  byte bVar26;
  char *pcVar27;
  bool bVar28;
  double x;
  string s;
  double local_60;
  double local_58;
  char *local_50;
  size_t local_48;
  char local_40 [16];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,'@');
  iVar11 = snprintf(local_50,local_48,"%.*e",d,0x10);
  std::__cxx11::string::resize((ulong)&local_50,(char)iVar11);
  cVar2 = *local_50;
  pcVar12 = local_50;
  cVar17 = cVar2;
  if (cVar2 == '-') {
    cVar17 = local_50[1];
    if ((byte)(cVar17 - 0x30U) < 10) {
      pcVar12 = local_50 + 1;
      goto LAB_0010261c;
    }
  }
  else {
LAB_0010261c:
    if (cVar17 == '0') {
      bVar20 = pcVar12[1];
      if (9 < (byte)(bVar20 - 0x30)) {
        pcVar22 = pcVar12 + 1;
        uVar23 = 0;
LAB_00102677:
        if (bVar20 == 0x2e) {
          if (9 < (byte)(pcVar22[1] - 0x30U)) goto LAB_00102808;
          uVar23 = (ulong)(byte)(pcVar22[1] - 0x30U) + uVar23 * 10;
          pcVar21 = pcVar22 + 2;
          bVar20 = pcVar22[2];
          while ((byte)(bVar20 - 0x30) < 10) {
            uVar23 = (ulong)(byte)(bVar20 - 0x30) + uVar23 * 10;
            pbVar1 = (byte *)(pcVar21 + 1);
            pcVar21 = pcVar21 + 1;
            bVar20 = *pbVar1;
          }
          pcVar27 = pcVar22 + (1 - (long)pcVar21);
          pcVar22 = pcVar21;
        }
        else {
          pcVar27 = (char *)0x0;
        }
        pcVar21 = pcVar22;
        if ((bVar20 | 0x20) == 0x65) {
          bVar28 = (pcVar22[1] - 0x2bU & 0xfd) == 0;
          pcVar24 = pcVar22 + 1;
          if (bVar28) {
            pcVar24 = pcVar22 + 2;
          }
          bVar20 = pcVar22[(ulong)bVar28 + 1] - 0x30;
          if (9 < bVar20) goto LAB_00102808;
          bVar26 = pcVar24[1] - 0x30;
          uVar15 = (ulong)bVar26 + (ulong)bVar20 * 10;
          if (9 < bVar26) {
            uVar15 = (ulong)bVar20;
          }
          pcVar21 = pcVar24 + 2;
          if (9 < bVar26) {
            pcVar21 = pcVar24 + 1;
          }
          bVar20 = pcVar24[(ulong)(bVar26 < 10) + 1] - 0x30;
          pcVar21 = pcVar21 + (bVar20 < 10);
          uVar14 = (ulong)bVar20 + uVar15 * 10;
          if (9 < bVar20) {
            uVar14 = uVar15;
          }
          cVar3 = *pcVar21;
          while ((byte)(cVar3 - 0x30U) < 10) {
            if ((long)uVar14 < 0x100000000) {
              uVar14 = (ulong)(byte)(cVar3 - 0x30U) + uVar14 * 10;
            }
            pcVar24 = pcVar21 + 1;
            pcVar21 = pcVar21 + 1;
            cVar3 = *pcVar24;
          }
          uVar15 = -uVar14;
          if (pcVar22[1] != '-') {
            uVar15 = uVar14;
          }
          pcVar27 = pcVar27 + uVar15;
        }
        if ((int)(~(uint)pcVar12 + (int)pcVar22) < 0x13) {
LAB_001027db:
          if (pcVar27 + -0x135 < (char *)0xfffffffffffffd86) goto LAB_001027ea;
          if ((uVar23 >> 0x35 == 0) && (pcVar27 + 0x16 < (char *)0x2d)) {
            if ((long)pcVar27 < 0) {
              local_60 = (double)(long)uVar23 /
                         *(double *)
                          (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                           power_of_ten + (long)pcVar27 * -8);
            }
            else {
              local_60 = (double)(long)uVar23 *
                         *(double *)
                          (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                           power_of_ten + (long)pcVar27 * 8);
            }
            if (cVar2 == '-') {
              local_60 = -local_60;
            }
          }
          else {
            if (uVar23 != 0) {
              uVar15 = 0x3f;
              if (uVar23 != 0) {
                for (; uVar23 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                }
              }
              uVar23 = uVar23 << ((byte)(uVar15 ^ 0x3f) & 0x3f);
              auVar4._8_8_ = 0;
              auVar4._0_8_ = uVar23;
              auVar6._8_8_ = 0;
              auVar6._0_8_ = *(ulong *)(fast_double_parser::
                                        compute_float_64(long,unsigned_long,bool,bool*)::mantissa_64
                                       + (long)pcVar27 * 8 + 0xa28);
              auVar4 = auVar4 * auVar6;
              uVar13 = auVar4._0_8_;
              uVar14 = auVar4._8_8_ & 0x1ff;
              if ((uVar14 == 0x1ff) && (uVar14 = 0x1ff, CARRY8(uVar13,uVar23))) {
                auVar5._8_8_ = 0;
                auVar5._0_8_ = uVar23;
                auVar7._8_8_ = 0;
                auVar7._0_8_ = *(ulong *)(fast_double_parser::
                                          compute_float_64(long,unsigned_long,bool,bool*)::
                                          mantissa_128 + (long)pcVar27 * 8 + 0xa28);
                uVar19 = SUB168(auVar5 * auVar7,8);
                auVar10._8_8_ = 0;
                auVar10._0_8_ = uVar19;
                auVar8._8_8_ = 0;
                auVar8._0_8_ = uVar19;
                auVar9._8_8_ = 0;
                auVar9._0_8_ = uVar19;
                auVar9 = auVar4 + auVar9;
                auVar8 = auVar4 + auVar8;
                uVar18 = auVar4._8_4_ + (uint)CARRY8(uVar13,uVar19) & 0x1ff;
                uVar14 = (ulong)uVar18;
                auVar4 = auVar4 + auVar10;
                if ((!CARRY8(SUB168(auVar5 * auVar7,0),uVar23)) ||
                   ((auVar4 = auVar8, uVar13 + uVar19 != -1 || (auVar4 = auVar9, uVar18 != 0x1ff))))
                goto LAB_001028b6;
              }
              else {
LAB_001028b6:
                uVar23 = auVar4._8_8_ >> (9U - (auVar4[0xf] >> 7) & 0x3f);
                uVar18 = (uint)uVar23;
                if ((auVar4._0_8_ != 0) || ((uVar14 != 0 || ((uVar18 & 3) != 1)))) {
                  uVar23 = (uVar18 & 1) + uVar23;
                  uVar14 = uVar23 >> 0x36;
                  uVar15 = (((long)pcVar27 * 0x3526a >> 0x10) + 0x43f) -
                           ((auVar4._8_8_ >> 0x3f ^ 1) + (uVar15 ^ 0x3f) + -1 + (ulong)(uVar14 == 0)
                           );
                  if ((uVar15 != 0) && (uVar15 < 0x7ff)) {
                    uVar13 = 0;
                    if (uVar14 == 0) {
                      uVar13 = uVar23 >> 1 & 0xefffffffffffff;
                    }
                    local_60 = (double)((ulong)(cVar2 == '-') << 0x3f | uVar13 | uVar15 << 0x34);
                    goto LAB_00102997;
                  }
                }
              }
              local_60 = 0.0;
              goto LAB_001027ea;
            }
            if (cVar2 == '-') {
              local_60 = -0.0;
            }
            else {
              local_60 = 0.0;
            }
          }
        }
        else {
          lVar25 = 1;
          while ((cVar17 == '0' || (cVar17 == '.'))) {
            pcVar24 = pcVar12 + lVar25;
            lVar25 = lVar25 + 1;
            cVar17 = *pcVar24;
          }
          if ((int)(((int)pcVar22 - (uint)pcVar12) - (int)lVar25) < 0x13) goto LAB_001027db;
LAB_001027ea:
          pcVar21 = fast_double_parser::parse_float_strtod(local_50,&local_60);
          if (pcVar21 == (char *)0x0) goto LAB_00102808;
        }
LAB_00102997:
        if (pcVar21 == local_50 + local_48) {
          if ((local_60 == d) && (!NAN(local_60) && !NAN(d))) {
            if (local_50 != local_40) {
              operator_delete(local_50);
            }
            return;
          }
          local_58 = local_60;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"fast_double_parser disagrees",0x1c);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          printf("fast_double_parser: %.*e\n",local_58,0x10);
          printf("reference: %.*e\n",d,0x10);
          printf("string: %s\n",local_50);
          if ((long)((ulong)local_58 ^ (ulong)d) < 0) {
            lVar25 = (long)d + (long)local_58 + 0x80000000;
          }
          else {
            lVar16 = (long)local_58 - (long)d;
            lVar25 = -lVar16;
            if (0 < lVar16) {
              lVar25 = lVar16;
            }
          }
          printf("f64_ulp_dist = %d\n",lVar25);
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"fast_double_parser disagrees");
        }
        else {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"does not point at the end");
        }
        goto LAB_00102a81;
      }
    }
    else if ((byte)(cVar17 - 0x30U) < 10) {
      uVar23 = (ulong)(byte)(cVar17 - 0x30U);
      bVar20 = pcVar12[1];
      pcVar27 = pcVar12;
      while( true ) {
        pcVar22 = pcVar27 + 1;
        if (9 < (byte)(bVar20 - 0x30)) break;
        uVar23 = (ulong)(byte)(bVar20 - 0x30) + uVar23 * 10;
        bVar20 = pcVar27[2];
        pcVar27 = pcVar22;
      }
      goto LAB_00102677;
    }
  }
LAB_00102808:
  printf("fast_double_parser refused to parse %s\n",local_50);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"fast_double_parser refused to parse");
LAB_00102a81:
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check(double d) {
  std::string s(64, '\0');
  auto written = std::snprintf(&s[0], s.size(), "%.*e", DBL_DIG + 1, d);
  s.resize(written);
  double x;
  const char * isok = fast_double_parser::parse_number(s.data(), &x);
  if (!isok) {
    printf("fast_double_parser refused to parse %s\n", s.c_str());
    throw std::runtime_error("fast_double_parser refused to parse");
  }
  if(isok != s.data() + s.size()) throw std::runtime_error("does not point at the end");
  if (d != x) {
    std::cerr << "fast_double_parser disagrees" << std::endl;
    printf("fast_double_parser: %.*e\n", DBL_DIG + 1, x);
    printf("reference: %.*e\n", DBL_DIG + 1, d);
    printf("string: %s\n", s.c_str());
    printf("f64_ulp_dist = %d\n", (int)f64_ulp_dist(x, d));
    throw std::runtime_error("fast_double_parser disagrees");
  }
}